

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Signature> *
wasm::WATParser::functype<wasm::WATParser::ParseTypeDefsCtx>
          (MaybeResult<wasm::Signature> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  bool bVar1;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> *params;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *results;
  basic_string_view<char,_std::char_traits<char>_> expected;
  SignatureT local_188;
  allocator<char> local_171;
  string local_170;
  Err local_150;
  Err local_130;
  Err *local_110;
  Err *err_1;
  MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> _val_1;
  MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> parsedResults;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> _val;
  MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> parsedParams;
  ParseTypeDefsCtx *ctx_local;
  
  expected = sv("func",4);
  bVar1 = Lexer::takeSExprStart(&ctx->in,expected);
  if (bVar1) {
    __return_storage_ptr___00 =
         (__index_type *)
         ((long)&_val.val.
                 super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> + 0x20);
    params<wasm::WATParser::ParseTypeDefsCtx>
              ((MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *)
               __return_storage_ptr___00,ctx,true);
    MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::MaybeResult
              ((MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *)
               local_78,(MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
                         *)__return_storage_ptr___00);
    local_90 = MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::getErr
                         ((MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
                           *)local_78);
    bVar1 = local_90 == (Err *)0x0;
    if (!bVar1) {
      wasm::Err::Err(&local_b0,local_90);
      MaybeResult<wasm::Signature>::MaybeResult(__return_storage_ptr__,&local_b0);
      wasm::Err::~Err(&local_b0);
    }
    MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::~MaybeResult
              ((MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *)
               local_78);
    if (bVar1) {
      results<wasm::WATParser::ParseTypeDefsCtx>
                ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
                 ((long)&_val_1.val.
                         super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> +
                 0x20),ctx);
      MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::MaybeResult
                ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)&err_1,
                 (MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
                 ((long)&_val_1.val.
                         super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> +
                 0x20));
      local_110 = MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::getErr
                            ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
                             &err_1);
      bVar1 = local_110 == (Err *)0x0;
      if (!bVar1) {
        wasm::Err::Err(&local_130,local_110);
        MaybeResult<wasm::Signature>::MaybeResult(__return_storage_ptr__,&local_130);
        wasm::Err::~Err(&local_130);
      }
      MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::~MaybeResult
                ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)&err_1);
      if (bVar1) {
        bVar1 = Lexer::takeRParen(&ctx->in);
        if (bVar1) {
          params = MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::
                   getPtr((MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
                           *)((long)&_val.val.
                                     super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                             + 0x20));
          results = MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::getPtr
                              ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *
                               )((long)&_val_1.val.
                                        super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                        .
                                        super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                        .
                                        super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                        .
                                        super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                + 0x20));
          local_188 = TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::makeFuncType
                                (&ctx->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>,params
                                 ,results);
          MaybeResult<wasm::Signature>::MaybeResult<wasm::Signature>
                    (__return_storage_ptr__,&local_188);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_170,"expected end of functype",&local_171);
          Lexer::err(&local_150,&ctx->in,&local_170);
          MaybeResult<wasm::Signature>::MaybeResult(__return_storage_ptr__,&local_150);
          wasm::Err::~Err(&local_150);
          std::__cxx11::string::~string((string *)&local_170);
          std::allocator<char>::~allocator(&local_171);
        }
      }
      MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::~MaybeResult
                ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
                 ((long)&_val_1.val.
                         super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> +
                 0x20));
    }
    MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::~MaybeResult
              ((MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *)
               ((long)&_val.val.
                       super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                       .super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                       .super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> +
               0x20));
  }
  else {
    MaybeResult<wasm::Signature>::MaybeResult(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::SignatureT> functype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("func"sv)) {
    return {};
  }

  auto parsedParams = params(ctx);
  CHECK_ERR(parsedParams);

  auto parsedResults = results(ctx);
  CHECK_ERR(parsedResults);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of functype");
  }

  return ctx.makeFuncType(parsedParams.getPtr(), parsedResults.getPtr());
}